

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.cc
# Opt level: O0

int features::Matching::count_consistent_matches(Result *matches)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_18;
  int local_14;
  int i;
  int counter;
  Result *matches_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&matches->matches_1_2);
    if ((int)sVar1 <= local_18) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&matches->matches_1_2,(long)local_18);
    if (*pvVar2 != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&matches->matches_1_2,(long)local_18);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&matches->matches_2_1,(long)*pvVar2);
      if (*pvVar2 == local_18) {
        local_14 = local_14 + 1;
      }
    }
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int
Matching::count_consistent_matches (Matching::Result const& matches)
{
    int counter = 0;
    for (int i = 0; i < static_cast<int>(matches.matches_1_2.size()); ++i)
        if (matches.matches_1_2[i] != -1
            && matches.matches_2_1[matches.matches_1_2[i]] == i)
            counter++;
    return counter;
}